

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

vector<Edge_*,_std::allocator<Edge_*>_> * __thiscall
RealCommandRunner::GetActiveEdges
          (vector<Edge_*,_std::allocator<Edge_*>_> *__return_storage_ptr__,RealCommandRunner *this)

{
  _Base_ptr p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
              (__return_storage_ptr__,(value_type *)&p_Var1[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Edge*> RealCommandRunner::GetActiveEdges() {
  vector<Edge*> edges;
  for (map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.begin();
       e != subproc_to_edge_.end(); ++e)
    edges.push_back(e->second);
  return edges;
}